

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccrun.c
# Opt level: O1

int tcc_relocate(TCCState *s1,void *ptr)

{
  int iVar1;
  uint uVar2;
  void *ptr_00;
  Elf64_Addr in_RDX;
  Elf64_Addr ptr_diff;
  
  if (ptr != (void *)0x1) {
    iVar1 = tcc_relocate_ex(s1,ptr,in_RDX);
    return iVar1;
  }
  iVar1 = 0;
  uVar2 = tcc_relocate_ex(s1,(void *)0x0,in_RDX);
  if ((int)uVar2 < 0) {
    iVar1 = -1;
  }
  else {
    ptr_00 = tcc_malloc((ulong)uVar2);
    tcc_relocate_ex(s1,ptr_00,ptr_diff);
    dynarray_add(&s1->runtime_mem,&s1->nb_runtime_mem,ptr_00);
  }
  return iVar1;
}

Assistant:

LIBTCCAPI int tcc_relocate(TCCState* s1, void* ptr) {
  int size;
  addr_t ptr_diff = 0;

  if (TCC_RELOCATE_AUTO != ptr)
    return tcc_relocate_ex(s1, ptr, 0);

  size = tcc_relocate_ex(s1, NULL, 0);
  if (size < 0)
    return -1;

#ifdef HAVE_SELINUX
  {
    /* Using mmap instead of malloc */
    void* prx;
    char tmpfname[] = "/tmp/.tccrunXXXXXX";
    int fd = mkstemp(tmpfname);
    unlink(tmpfname);
    ftruncate(fd, size);

    ptr = mmap(NULL, size, PROT_READ | PROT_WRITE, MAP_SHARED, fd, 0);
    prx = mmap(NULL, size, PROT_READ | PROT_EXEC, MAP_SHARED, fd, 0);
    if (ptr == MAP_FAILED || prx == MAP_FAILED)
      tcc_error("tccrun: could not map memory");
    dynarray_add(&s1->runtime_mem, &s1->nb_runtime_mem, (void*)(addr_t)size);
    dynarray_add(&s1->runtime_mem, &s1->nb_runtime_mem, prx);
    ptr_diff = (char*)prx - (char*)ptr;
  }
#else
  ptr = tcc_malloc(size);
#endif
  tcc_relocate_ex(s1, ptr, ptr_diff); /* no more errors expected */
  dynarray_add(&s1->runtime_mem, &s1->nb_runtime_mem, ptr);
  return 0;
}